

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::ConvertMaterial
          (Discreet3DSImporter *this,Material *oldMat,aiMaterial *mat)

{
  ulong uVar1;
  int eShading_;
  int i;
  aiString name;
  shadetype3ds local_83c;
  aiString local_838;
  aiString local_434;
  
  uVar1 = (this->mBackgroundImage)._M_string_length;
  if ((uVar1 != 0) && (this->bHasBG == true)) {
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    if (uVar1 < 0x400) {
      local_434.length = (ai_uint32)uVar1;
      memcpy(local_434.data,(this->mBackgroundImage)._M_dataplus._M_p,uVar1);
      local_434.data[uVar1] = '\0';
    }
    aiMaterial::AddProperty(mat,&local_434,"?bg.global",0,0);
    local_838._0_8_ = local_838.data + 0xc;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"");
    std::__cxx11::string::operator=((string *)&this->mBackgroundImage,(string *)&local_838);
    if ((char *)local_838._0_8_ != local_838.data + 0xc) {
      operator_delete((void *)local_838._0_8_,local_838.data._12_8_ + 1);
    }
  }
  (oldMat->mAmbient).r = (this->mClrAmbient).r + (oldMat->mAmbient).r;
  (oldMat->mAmbient).g = (this->mClrAmbient).g + (oldMat->mAmbient).g;
  (oldMat->mAmbient).b = (this->mClrAmbient).b + (oldMat->mAmbient).b;
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  uVar1 = (oldMat->mName)._M_string_length;
  if (uVar1 < 0x400) {
    local_434.length = (ai_uint32)uVar1;
    memcpy(local_434.data,(oldMat->mName)._M_dataplus._M_p,uVar1);
    local_434.data[uVar1] = '\0';
  }
  aiMaterial::AddProperty(mat,&local_434,"?mat.name",0,0);
  aiMaterial::AddBinaryProperty(mat,&oldMat->mAmbient,0xc,"$clr.ambient",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(mat,&oldMat->mDiffuse,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(mat,&oldMat->mSpecular,0xc,"$clr.specular",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(mat,&oldMat->mEmissive,0xc,"$clr.emissive",0,0,aiPTI_Float);
  if (oldMat->mShading == Phong || oldMat->mShading == Metal) {
    if (((oldMat->mSpecularExponent == 0.0) && (!NAN(oldMat->mSpecularExponent))) ||
       ((oldMat->mShininessStrength == 0.0 && (!NAN(oldMat->mShininessStrength))))) {
      oldMat->mShading = Gouraud;
    }
    else {
      aiMaterial::AddBinaryProperty
                (mat,&oldMat->mSpecularExponent,4,"$mat.shininess",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (mat,&oldMat->mShininessStrength,4,"$mat.shinpercent",0,0,aiPTI_Float);
    }
  }
  aiMaterial::AddBinaryProperty(mat,&oldMat->mTransparency,4,"$mat.opacity",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(mat,&oldMat->mBumpHeight,4,"$mat.bumpscaling",0,0,aiPTI_Float);
  if (oldMat->mTwoSided == true) {
    local_838.length = 1;
    aiMaterial::AddBinaryProperty(mat,&local_838,4,"$mat.twosided",0,0,aiPTI_Integer);
  }
  local_83c = oldMat->mShading;
  switch(local_83c) {
  case Wire:
    local_838.length = 1;
    aiMaterial::AddBinaryProperty(mat,&local_838,4,"$mat.wireframe",0,0,aiPTI_Integer);
  case Gouraud:
    local_83c = Gouraud;
    break;
  case Flat:
  case Phong:
    break;
  case Metal:
    local_83c = 8;
    break;
  case Blinn:
    local_83c = Metal;
    break;
  default:
    local_83c = 9;
  }
  aiMaterial::AddBinaryProperty(mat,&local_83c,4,"$mat.shadingm",0,0,aiPTI_Integer);
  if ((oldMat->sTexDiffuse).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexDiffuse,aiTextureType_DIFFUSE);
  }
  if ((oldMat->sTexSpecular).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexSpecular,aiTextureType_SPECULAR);
  }
  if ((oldMat->sTexOpacity).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexOpacity,aiTextureType_OPACITY);
  }
  if ((oldMat->sTexEmissive).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexEmissive,aiTextureType_EMISSIVE);
  }
  if ((oldMat->sTexBump).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexBump,aiTextureType_HEIGHT);
  }
  if ((oldMat->sTexShininess).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexShininess,aiTextureType_SHININESS);
  }
  if ((oldMat->sTexReflective).mMapName._M_string_length != 0) {
    CopyTexture(mat,&oldMat->sTexReflective,aiTextureType_REFLECTION);
  }
  uVar1 = (oldMat->mName)._M_string_length;
  if (uVar1 != 0) {
    local_838._0_8_ = local_838._0_8_ & 0xffffff0000000000;
    memset((void *)((long)&local_838 + 5),0x1b,0x3ff);
    if (uVar1 < 0x400) {
      local_838.length = (int)uVar1;
      memcpy((void *)((long)&local_838 + 4),(oldMat->mName)._M_dataplus._M_p,uVar1);
      *(undefined1 *)((long)&local_838 + uVar1 + 4) = 0;
    }
    aiMaterial::AddProperty(mat,&local_838,"?mat.name",0,0);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ConvertMaterial(D3DS::Material& oldMat,
    aiMaterial& mat)
{
    // NOTE: Pass the background image to the viewer by bypassing the
    // material system. This is an evil hack, never do it again!
    if (0 != mBackgroundImage.length() && bHasBG)
    {
        aiString tex;
        tex.Set( mBackgroundImage);
        mat.AddProperty( &tex, AI_MATKEY_GLOBAL_BACKGROUND_IMAGE);

        // Be sure this is only done for the first material
        mBackgroundImage = std::string("");
    }

    // At first add the base ambient color of the scene to the material
    oldMat.mAmbient.r += mClrAmbient.r;
    oldMat.mAmbient.g += mClrAmbient.g;
    oldMat.mAmbient.b += mClrAmbient.b;

    aiString name;
    name.Set( oldMat.mName);
    mat.AddProperty( &name, AI_MATKEY_NAME);

    // Material colors
    mat.AddProperty( &oldMat.mAmbient, 1, AI_MATKEY_COLOR_AMBIENT);
    mat.AddProperty( &oldMat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
    mat.AddProperty( &oldMat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
    mat.AddProperty( &oldMat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);

    // Phong shininess and shininess strength
    if (D3DS::Discreet3DS::Phong == oldMat.mShading ||
        D3DS::Discreet3DS::Metal == oldMat.mShading)
    {
        if (!oldMat.mSpecularExponent || !oldMat.mShininessStrength)
        {
            oldMat.mShading = D3DS::Discreet3DS::Gouraud;
        }
        else
        {
            mat.AddProperty( &oldMat.mSpecularExponent, 1, AI_MATKEY_SHININESS);
            mat.AddProperty( &oldMat.mShininessStrength, 1, AI_MATKEY_SHININESS_STRENGTH);
        }
    }

    // Opacity
    mat.AddProperty<ai_real>( &oldMat.mTransparency,1,AI_MATKEY_OPACITY);

    // Bump height scaling
    mat.AddProperty<ai_real>( &oldMat.mBumpHeight,1,AI_MATKEY_BUMPSCALING);

    // Two sided rendering?
    if (oldMat.mTwoSided)
    {
        int i = 1;
        mat.AddProperty<int>(&i,1,AI_MATKEY_TWOSIDED);
    }

    // Shading mode
    aiShadingMode eShading = aiShadingMode_NoShading;
    switch (oldMat.mShading)
    {
        case D3DS::Discreet3DS::Flat:
            eShading = aiShadingMode_Flat; break;

        // I don't know what "Wire" shading should be,
        // assume it is simple lambertian diffuse shading
        case D3DS::Discreet3DS::Wire:
            {
                // Set the wireframe flag
                unsigned int iWire = 1;
                mat.AddProperty<int>( (int*)&iWire,1,AI_MATKEY_ENABLE_WIREFRAME);
            }

        case D3DS::Discreet3DS::Gouraud:
            eShading = aiShadingMode_Gouraud; break;

        // assume cook-torrance shading for metals.
        case D3DS::Discreet3DS::Phong :
            eShading = aiShadingMode_Phong; break;

        case D3DS::Discreet3DS::Metal :
            eShading = aiShadingMode_CookTorrance; break;

            // FIX to workaround a warning with GCC 4 who complained
            // about a missing case Blinn: here - Blinn isn't a valid
            // value in the 3DS Loader, it is just needed for ASE
        case D3DS::Discreet3DS::Blinn :
            eShading = aiShadingMode_Blinn; break;
    }
    int eShading_ = static_cast<int>(eShading);
    mat.AddProperty<int>(&eShading_, 1, AI_MATKEY_SHADING_MODEL);

    // DIFFUSE texture
    if( oldMat.sTexDiffuse.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexDiffuse, aiTextureType_DIFFUSE);

    // SPECULAR texture
    if( oldMat.sTexSpecular.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexSpecular, aiTextureType_SPECULAR);

    // OPACITY texture
    if( oldMat.sTexOpacity.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexOpacity, aiTextureType_OPACITY);

    // EMISSIVE texture
    if( oldMat.sTexEmissive.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexEmissive, aiTextureType_EMISSIVE);

    // BUMP texture
    if( oldMat.sTexBump.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexBump, aiTextureType_HEIGHT);

    // SHININESS texture
    if( oldMat.sTexShininess.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexShininess, aiTextureType_SHININESS);

    // REFLECTION texture
    if( oldMat.sTexReflective.mMapName.length() > 0)
        CopyTexture(mat,oldMat.sTexReflective, aiTextureType_REFLECTION);

    // Store the name of the material itself, too
    if( oldMat.mName.length())  {
        aiString tex;
        tex.Set( oldMat.mName);
        mat.AddProperty( &tex, AI_MATKEY_NAME);
    }
}